

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O2

void __thiscall
TaprootUtil_CreateTapScriptControl_Test::TestBody(TaprootUtil_CreateTapScriptControl_Test *this)

{
  ScriptBuilder *this_00;
  long lVar1;
  char *pcVar2;
  char *in_R9;
  TapScriptData *expected_predicate_value;
  initializer_list<cfd::core::ByteData256> __l;
  undefined8 in_stack_fffffffffffff828;
  uint uVar3;
  bool is_parity;
  AssertHelper local_7c8;
  SchnorrSignature sig2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b8 [9];
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_8;
  SchnorrSignature schnorr_sig;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_738 [4];
  AssertHelper local_718;
  SigHashType sighash_type;
  Transaction tx2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6f8 [7];
  Transaction tx1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6b8 [7];
  SchnorrPubkey schnorr_pubkey;
  ByteData256 sighash2;
  Address addr2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_648 [46];
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxo_list;
  Pubkey pk1;
  SchnorrPubkey pk0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  Amount amt1;
  ByteData der_sig;
  ByteData sig;
  ByteData256 sighash;
  ByteData taproot_control;
  Pubkey pubkey;
  SigHashType local_3f0 [12];
  SigHashType local_3e4 [12];
  TapScriptData script_data;
  Privkey key;
  TaprootScriptTree tree;
  Privkey key1;
  Script locking_script;
  Address addr01;
  ByteData256 local_298 [14];
  Script redeem_script;
  Script pkh_script1;
  ScriptWitness local_c8;
  ScriptWitness local_a8;
  ScriptWitness local_88;
  ScriptWitness local_68;
  ScriptWitness local_48;
  
  std::__cxx11::string::string
            ((string *)&addr01,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             (allocator *)&addr2);
  cfd::core::Privkey::Privkey(&key,(string *)&addr01,kMainnet,true);
  std::__cxx11::string::~string((string *)&addr01);
  cfd::core::Privkey::GeneratePubkey(SUB81(&pubkey,0));
  cfd::core::SchnorrPubkey::FromPubkey((Pubkey *)&schnorr_pubkey,(bool *)&pubkey);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&addr2,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "schnorr_pubkey.GetHex()",(char (*) [65])0x3657a6,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr01);
  std::__cxx11::string::~string((string *)&addr01);
  if (addr2 == (Address)0x0) {
    testing::Message::Message((Message *)&addr01);
    if (local_648[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_648[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&addr01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr01);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_648);
  addr2 = (Address)0x0;
  local_648[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&tree);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&addr01,(internal *)&addr2,(AssertionResult *)"is_parity","false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&sig2,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
             ,0x39,(char *)_addr01);
  testing::internal::AssertHelper::operator=((AssertHelper *)&sig2,(Message *)&tree);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig2);
  std::__cxx11::string::~string((string *)&addr01);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&tree);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_648);
  _addr01 = &PTR__ScriptBuilder_004530b8;
  local_298[0].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData();
  this_00 = (ScriptBuilder *)
            cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&addr01,(ByteData *)&addr2);
  cfd::core::ScriptBuilder::operator<<
            (this_00,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&addr01);
  std::__cxx11::string::string
            ((string *)&addr2,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&sig2);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&addr01,(string *)&addr2);
  std::__cxx11::string::string
            ((string *)&tree,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)&tx1);
  cfd::core::ByteData256::ByteData256(local_298,(string *)&tree);
  __l._M_len = 2;
  __l._M_array = (iterator)&addr01;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&nodes,__l,(allocator_type *)&tx2);
  lVar1 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(&addr01 + lVar1));
    uVar3 = (uint)((ulong)in_stack_fffffffffffff828 >> 0x20);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string((string *)&tree);
  std::__cxx11::string::~string((string *)&addr2);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&redeem_script);
  cfd::core::TaprootScriptTree::AddBranch((ByteData256 *)&tree);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)&addr01,
             nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_start + 1);
  cfd::core::TapBranch::AddBranch((SchnorrPubkey *)&tree);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr01);
  cfd::core::Script::Script(&locking_script);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&pk0);
  cfd::core::TaprootUtil::CreateTapScriptControl
            ((SchnorrPubkey *)&taproot_control,(TapBranch *)&schnorr_pubkey,(SchnorrPubkey *)&tree,
             (Script *)&pk0);
  cfd::core::Address::Address(&addr01,kRegtest,kVersion1,&pk0);
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&sig2,
             "\"bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666\"",
             "addr01.GetAddress()",
             (char (*) [65])"bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if (sig2 == (SchnorrSignature)0x0) {
    testing::Message::Message((Message *)&addr2);
    if (local_7b8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_7b8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx1,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_7b8);
  cfd::core::Script::GetHex_abi_cxx11_();
  cfd::core::Address::GetLockingScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&tx2,"locking_script.GetHex()","addr01.GetLockingScript().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx1);
  std::__cxx11::string::~string((string *)&tx1);
  cfd::core::Script::~Script((Script *)&addr2);
  std::__cxx11::string::~string((string *)&sig2);
  if (tx2 == (Transaction)0x0) {
    testing::Message::Message((Message *)&addr2);
    if (local_6f8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_6f8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_6f8);
  cfd::core::Address::GetLockingScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tx1,
             "\"51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2\"",
             "addr01.GetLockingScript().GetHex()",
             (char (*) [69])"51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  cfd::core::Script::~Script((Script *)&addr2);
  if (tx1 == (Transaction)0x0) {
    testing::Message::Message((Message *)&addr2);
    if (local_6b8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_6b8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_6b8);
  cfd::core::Transaction::Transaction(&tx1,2,0);
  std::__cxx11::string::string
            ((string *)&sig2,"cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd",
             (allocator *)&tx2);
  cfd::core::Txid::Txid((Txid *)&addr2,(string *)&sig2);
  cfd::core::Transaction::AddTxIn((Txid *)&tx1,(uint)&addr2,0,(Script *)0xffffffffffffffff);
  cfd::core::Txid::~Txid((Txid *)&addr2);
  std::__cxx11::string::~string((string *)&sig2);
  cfd::core::Amount::Amount(&amt1,0x9502f518);
  cfd::core::Transaction::AddTxOut((Amount *)&tx1,(Script *)&amt1);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[189],std::__cxx11::string>
            ((internal *)&sig2,
             "\"0200000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d200000000\""
             ,"tx1.GetHex()",
             (char (*) [189])
             "0200000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d200000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if (sig2 == (SchnorrSignature)0x0) {
    testing::Message::Message((Message *)&addr2);
    if (local_7b8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_7b8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_7b8);
  std::__cxx11::string::string
            ((string *)&addr2,"cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57",
             (allocator *)&sig2);
  cfd::core::Privkey::FromWif((string *)&key1,(NetType)&addr2,true);
  std::__cxx11::string::~string((string *)&addr2);
  std::__cxx11::string::string
            ((string *)&addr2,"023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
             (allocator *)&sig2);
  cfd::core::Pubkey::Pubkey(&pk1,(string *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  cfd::core::ScriptUtil::CreateP2pkhLockingScript((Pubkey *)&pkh_script1);
  cfd::core::SigHashType::SigHashType(&sighash_type);
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_3e4,&sighash_type);
  cfd::core::Amount::Amount((Amount *)&sig2,2500000000);
  cfd::core::Transaction::GetSignatureHash
            (&sighash,&tx1,0,&addr2,local_3e4,&sig2,(ulong)uVar3 << 0x20);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::Privkey::CalculateEcSignature((ByteData256 *)&sig,SUB81(&key1,0));
  cfd::core::CryptoUtil::ConvertSignatureToDer(&der_sig,(SigHashType *)&sig);
  cfd::core::Transaction::AddScriptWitnessStack((uint)&local_48,(ByteData *)&tx1);
  cfd::core::ScriptWitness::~ScriptWitness(&local_48);
  cfd::core::Pubkey::GetData();
  cfd::core::Transaction::AddScriptWitnessStack((uint)&local_68,(ByteData *)&tx1);
  cfd::core::ScriptWitness::~ScriptWitness(&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[407],std::__cxx11::string>
            ((internal *)&sig2,
             "\"02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000\""
             ,"tx1.GetHex()",
             (char (*) [407])
             "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if (sig2 == (SchnorrSignature)0x0) {
    testing::Message::Message((Message *)&addr2);
    if (local_7b8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_7b8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_7b8);
  cfd::core::Transaction::Transaction(&tx2,2,0);
  cfd::core::AbstractTransaction::GetTxid();
  cfd::core::Transaction::AddTxIn((Txid *)&tx2,(uint)&addr2,0,(Script *)0xffffffffffffffff);
  cfd::core::Txid::~Txid((Txid *)&addr2);
  std::__cxx11::string::string
            ((string *)&sig2,"bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
             (allocator *)&schnorr_sig);
  cfd::core::Address::Address(&addr2,(string *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  cfd::core::Amount::Amount((Amount *)&schnorr_sig,0x9502f130);
  cfd::core::Address::GetLockingScript();
  cfd::core::Transaction::AddTxOut((Amount *)&tx2,(Script *)&schnorr_sig);
  cfd::core::Script::~Script((Script *)&sig2);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::vector
            (&utxo_list,1,(allocator_type *)&sig2);
  cfd::core::TxOut::TxOut((TxOut *)&sig2,&amt1,&locking_script);
  cfd::core::AbstractTxOut::operator=
            ((AbstractTxOut *)
             utxo_list.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
             _M_impl.super__Vector_impl_data._M_start,(AbstractTxOut *)&sig2);
  cfd::core::AbstractTxOut::~AbstractTxOut((AbstractTxOut *)&sig2);
  cfd::core::TapScriptData::TapScriptData(&script_data);
  cfd::core::TaprootScriptTree::GetTapLeafHash();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data,&sig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  cfd::core::SigHashType::SigHashType(local_3f0,&sighash_type);
  cfd::core::ByteData::ByteData((ByteData *)&sig2);
  expected_predicate_value = &script_data;
  cfd::core::Transaction::GetSchnorrSignatureHash
            (&sighash2,&tx2,0,local_3f0,&utxo_list,expected_predicate_value,&sig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&schnorr_sig,
             "\"80e53eaee13048aee9c6c13fa5a8529aad7fe2c362bfc16f1e2affc71f591d36\"",
             "sighash2.GetHex()",
             (char (*) [65])"80e53eaee13048aee9c6c13fa5a8529aad7fe2c362bfc16f1e2affc71f591d36",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  if (schnorr_sig == (SchnorrSignature)0x0) {
    testing::Message::Message((Message *)&sig2);
    if (local_738[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_738[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&sig2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_738);
  cfd::core::SchnorrUtil::Sign((ByteData256 *)&sig2,(Privkey *)&sighash2);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_(SUB81(&schnorr_sig,0));
  testing::internal::CmpHelperEQ<char[129],std::__cxx11::string>
            ((internal *)&gtest_ar_7,
             "\"f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee9\""
             ,"sig2.GetHex()",
             (char (*) [129])
             "f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee9"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&schnorr_sig);
  std::__cxx11::string::~string((string *)&schnorr_sig);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&schnorr_sig);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)&schnorr_sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&schnorr_sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  cfd::core::SchnorrSignature::SchnorrSignature(&schnorr_sig,&sig2);
  cfd::core::SchnorrSignature::SetSigHashType((SigHashType *)&schnorr_sig);
  cfd::core::SchnorrSignature::GetData(SUB81(&gtest_ar_7,0));
  cfd::core::Transaction::AddScriptWitnessStack((uint)&local_88,(ByteData *)&tx2);
  cfd::core::ScriptWitness::~ScriptWitness(&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_7);
  cfd::core::Script::GetData();
  cfd::core::Transaction::AddScriptWitnessStack((uint)&local_a8,(ByteData *)&tx2);
  cfd::core::ScriptWitness::~ScriptWitness(&local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_7);
  cfd::core::Transaction::AddScriptWitnessStack((uint)&local_c8,(ByteData *)&tx2);
  cfd::core::ScriptWitness::~ScriptWitness(&local_c8);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[569],std::__cxx11::string>
            ((internal *)&gtest_ar_8,
             "\"020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000\""
             ,"tx2.GetHex()",
             (char (*) [569])
             "020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_7);
  std::__cxx11::string::~string((string *)&gtest_ar_7);
  if (gtest_ar_8.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_7);
    if (gtest_ar_8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7c8,(Message *)&gtest_ar_7);
    testing::internal::AssertHelper::~AssertHelper(&local_7c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_8.message_);
  gtest_ar_8.success_ =
       (bool)cfd::core::SchnorrPubkey::Verify
                       ((SchnorrSignature *)&schnorr_pubkey,(ByteData256 *)&schnorr_sig);
  gtest_ar_8.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (gtest_ar_8.success_ == false) {
    testing::Message::Message((Message *)&local_7c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7,(internal *)&gtest_ar_8,
               (AssertionResult *)"schnorr_pubkey.Verify(schnorr_sig, sighash2)","false","true",
               (char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_718,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_util.cpp"
               ,0x76,(char *)CONCAT71(gtest_ar_7._1_7_,gtest_ar_7.success_));
    testing::internal::AssertHelper::operator=(&local_718,(Message *)&local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_718);
    std::__cxx11::string::~string((string *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_7c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_8.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&utxo_list);
  cfd::core::Address::~Address(&addr2);
  cfd::core::Transaction::~Transaction(&tx2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&der_sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
  cfd::core::Script::~Script(&pkh_script1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key1);
  cfd::core::Transaction::~Transaction(&tx1);
  cfd::core::Address::~Address(&addr01);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&taproot_control);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk0);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
  cfd::core::Script::~Script(&redeem_script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControl) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script redeem_script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")
  };
  TaprootScriptTree tree(redeem_script);
  tree.AddBranch(nodes[0]);
  tree.AddBranch(SchnorrPubkey(nodes[1]));
  // auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  // Script locking_script = ScriptUtil::CreateTaprootLockingScript(
  //   pk.GetByteData256());
  Script locking_script;
  SchnorrPubkey pk0;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, &pk0, &locking_script);
  Address addr01(NetType::kRegtest, WitnessVersion::kVersion1, pk0);
  EXPECT_EQ("bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666", addr01.GetAddress());
  EXPECT_EQ(locking_script.GetHex(), addr01.GetLockingScript().GetHex());
  EXPECT_EQ("51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2", addr01.GetLockingScript().GetHex());

  Transaction tx1(2, 0);
  tx1.AddTxIn(
      Txid("cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd"),
      0, 0xffffffff);  // bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40
  Amount amt1(int64_t{2499999000});
  tx1.AddTxOut(amt1, locking_script);
  EXPECT_EQ("0200000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d200000000", tx1.GetHex());
  Privkey key1 = Privkey::FromWif("cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57");
  Pubkey pk1("023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44");
  auto pkh_script1 = ScriptUtil::CreateP2pkhLockingScript(pk1);
  SigHashType sighash_type;
  auto sighash = tx1.GetSignatureHash(0, pkh_script1.GetData(),
        sighash_type, Amount(int64_t{2500000000}), WitnessVersion::kVersion0);
  auto sig = key1.CalculateEcSignature(sighash);
  auto der_sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
  tx1.AddScriptWitnessStack(0, der_sig);
  tx1.AddScriptWitnessStack(0, pk1.GetData());
  EXPECT_EQ("02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000", tx1.GetHex());
  
  Transaction tx2(2, 0);
  tx2.AddTxIn(tx1.GetTxid(), 0, 0xffffffff);  // taproot
  Address addr2("bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40");
  tx2.AddTxOut(Amount(int64_t{2499998000}), addr2.GetLockingScript());
  std::vector<TxOut> utxo_list(1);
  utxo_list[0] = TxOut(amt1, locking_script);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  auto sighash2 = tx2.GetSchnorrSignatureHash(0, sighash_type, utxo_list, &script_data);
  EXPECT_EQ("80e53eaee13048aee9c6c13fa5a8529aad7fe2c362bfc16f1e2affc71f591d36", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee9", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx2.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx2.AddScriptWitnessStack(0, redeem_script.GetData());
  tx2.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000", tx2.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}